

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O2

void __thiscall
CoreML::TreeEnsembleRegressor::TreeEnsembleRegressor
          (TreeEnsembleRegressor *this,string *predictedValueOutput,string *description)

{
  TreeEnsembleRegressor *pTVar1;
  ModelDescription *this_00;
  Model local_30;
  
  Model::Model(&local_30,description);
  TreeEnsembleBase::TreeEnsembleBase(&this->super_TreeEnsembleBase,&local_30,false);
  Model::~Model(&local_30);
  (this->super_TreeEnsembleBase).super_Model._vptr_Model =
       (_func_int **)&PTR__TreeEnsembleRegressor_0034b9f8;
  pTVar1 = Specification::Model::mutable_treeensembleregressor
                     ((this->super_TreeEnsembleBase).super_Model.m_spec.
                      super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  this->tree_regressor_parameters = pTVar1;
  this_00 = Specification::Model::mutable_description
                      ((this->super_TreeEnsembleBase).super_Model.m_spec.
                       super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  Specification::ModelDescription::set_predictedfeaturename(this_00,predictedValueOutput);
  return;
}

Assistant:

TreeEnsembleRegressor::TreeEnsembleRegressor
    (const std::string& predictedValueOutput,
     const std::string& description)
    : TreeEnsembleBase(Model(description), false /* isClassifier */)
    , tree_regressor_parameters(m_spec->mutable_treeensembleregressor())
    {
        m_spec->mutable_description()->set_predictedfeaturename(predictedValueOutput);
    }